

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O2

void zmSqr(word *b,word *a,qr_o *r,void *stack)

{
  void *stack_00;
  
  stack_00 = (void *)(r->n * 0x10 + (long)stack);
  zzSqr((word *)stack,a,r->n,stack_00);
  zzRed((word *)stack,r->mod,r->n,stack_00);
  wwCopy(b,(word *)stack,r->n);
  return;
}

Assistant:

static void zmSqr(word b[], const word a[], const qr_o* r, void* stack)
{
	word* prod = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	stack = prod + 2 * r->n;
	zzSqr(prod, a, r->n, stack);
	zzRed(prod, r->mod, r->n, stack);
	wwCopy(b, prod, r->n);
}